

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree234.c
# Opt level: O0

int countnode234(node234_conflict *n)

{
  int local_20;
  int local_1c;
  int i;
  int count;
  node234_conflict *n_local;
  
  local_1c = 0;
  if (n == (node234_conflict *)0x0) {
    n_local._4_4_ = 0;
  }
  else {
    for (local_20 = 0; local_20 < 4; local_20 = local_20 + 1) {
      local_1c = n->counts[local_20] + local_1c;
    }
    for (local_20 = 0; local_20 < 3; local_20 = local_20 + 1) {
      if (n->elems[local_20] != (void *)0x0) {
        local_1c = local_1c + 1;
      }
    }
    n_local._4_4_ = local_1c;
  }
  return n_local._4_4_;
}

Assistant:

static int countnode234(node234 * n)
{
    int count = 0;
    int i;
    if (!n)
        return 0;
    for (i = 0; i < 4; i++)
        count += n->counts[i];
    for (i = 0; i < 3; i++)
        if (n->elems[i])
            count++;
    return count;
}